

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_indexOfMax(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_rcdesc rc;
  
  vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"Vector.indexOfMax");
  get_minmax(this,self,retval,argc,&rc,1,1);
  return 1;
}

Assistant:

int CVmObjVector::getp_indexOfMax(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "Vector.indexOfMax", self, 34, G_stk->get(0),
                 argc != 0 ? *argc : 0);
    return get_minmax(vmg_ self, retval, argc, &rc, 1, TRUE);
}